

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

RealType __thiscall OpenMD::Snapshot::getXYarea(Snapshot *this)

{
  Vector<double,_3U> *in_RDI;
  double dVar1;
  Vector3d y;
  Vector3d x;
  Vector3<double> *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff94;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffff98;
  Vector3<double> *in_stack_ffffffffffffffe0;
  Vector3<double> *in_stack_ffffffffffffffe8;
  
  if ((*(byte *)((long)in_RDI[0x6f].data_ + 0x12) & 1) == 0) {
    RectMatrix<double,_3U,_3U>::getColumn(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    Vector3<double>::Vector3(in_stack_ffffffffffffff80,in_RDI);
    RectMatrix<double,_3U,_3U>::getColumn(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    Vector3<double>::Vector3(in_stack_ffffffffffffff80,in_RDI);
    cross<double>(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    dVar1 = Vector<double,_3U>::length((Vector<double,_3U> *)0x245a9d);
    in_RDI[0x54].data_[1] = dVar1;
    *(undefined1 *)((long)in_RDI[0x6f].data_ + 0x12) = 1;
  }
  return in_RDI[0x54].data_[1];
}

Assistant:

RealType Snapshot::getXYarea() {
    if (!hasXYarea) {
      Vector3d x       = frameData.hmat.getColumn(0);
      Vector3d y       = frameData.hmat.getColumn(1);
      frameData.xyArea = cross(x, y).length();
      hasXYarea        = true;
    }
    return frameData.xyArea;
  }